

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O1

Token * __thiscall clickhouse::TypeParser::NextToken(Token *__return_storage_ptr__,TypeParser *this)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  int iVar7;
  byte *pbVar8;
  
  pbVar8 = (byte *)this->cur_;
  pbVar2 = (byte *)this->end_;
  if (pbVar8 < pbVar2) {
    do {
      bVar1 = *pbVar8;
      if (0x1f < bVar1) {
        if (bVar1 == 0x20) goto LAB_00147955;
        switch(bVar1) {
        case 0x27:
          pbVar8 = pbVar8 + 1;
          this->cur_ = (char *)pbVar8;
          if (pbVar2 <= pbVar8) goto LAB_00147a55;
          sVar5 = 0;
          pbVar6 = pbVar8;
          goto LAB_0014799b;
        case 0x28:
          __return_storage_ptr__->type = LPar;
          break;
        case 0x29:
          __return_storage_ptr__->type = RPar;
          break;
        case 0x2a:
        case 0x2b:
          goto switchD_00147985_caseD_2a;
        case 0x2c:
          __return_storage_ptr__->type = Comma;
          break;
        default:
          if (bVar1 == 0x3d) {
            __return_storage_ptr__->type = Assign;
            break;
          }
switchD_00147985_caseD_2a:
          iVar4 = isalpha((int)(char)bVar1);
          if ((bVar1 == 0x5f) || (iVar4 != 0)) {
            pbVar6 = (byte *)this->cur_;
            if (pbVar6 < pbVar2) goto LAB_00147a68;
            goto LAB_00147a8f;
          }
          if (bVar1 != 0x2d && 9 < (int)(char)bVar1 - 0x30U) goto LAB_00147a55;
          sVar3 = 1;
          goto LAB_00147a30;
        }
        this->cur_ = (char *)(pbVar8 + 1);
        (__return_storage_ptr__->value)._M_len = 1;
        goto LAB_001479ea;
      }
      if ((1 < bVar1 - 9) && (bVar1 != 0)) goto switchD_00147985_caseD_2a;
LAB_00147955:
      pbVar8 = pbVar8 + 1;
      this->cur_ = (char *)pbVar8;
    } while (pbVar8 != pbVar2);
  }
  __return_storage_ptr__->type = EOS;
  goto LAB_00147966;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    this->cur_ = (char *)pbVar6;
    if (pbVar6 == pbVar2) break;
LAB_00147a68:
    iVar7 = (int)(char)*pbVar6;
    iVar4 = isalpha(iVar7);
    if (((iVar7 != 0x5f) && (iVar4 == 0)) && (9 < iVar7 - 0x30U)) break;
  }
LAB_00147a8f:
  __return_storage_ptr__->type = Name;
  (__return_storage_ptr__->value)._M_len = (long)pbVar6 - (long)pbVar8;
  goto LAB_001479ea;
  while (sVar3 = sVar5 + 1, (int)(char)*pbVar6 - 0x30U < 10) {
LAB_00147a30:
    sVar5 = sVar3;
    pbVar6 = pbVar8 + sVar5;
    this->cur_ = (char *)pbVar6;
    if (pbVar2 <= pbVar6) break;
  }
  __return_storage_ptr__->type = Number;
LAB_00147aad:
  (__return_storage_ptr__->value)._M_len = sVar5;
LAB_001479ea:
  (__return_storage_ptr__->value)._M_str = (char *)pbVar8;
  return __return_storage_ptr__;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    this->cur_ = (char *)pbVar6;
    sVar5 = sVar5 + 1;
    if (pbVar2 <= pbVar6) break;
LAB_0014799b:
    if (*pbVar6 == 0x27) {
      __return_storage_ptr__->type = String;
      this->cur_ = (char *)(pbVar6 + 1);
      goto LAB_00147aad;
    }
  }
LAB_00147a55:
  __return_storage_ptr__->type = Invalid;
LAB_00147966:
  (__return_storage_ptr__->value)._M_len = 0;
  (__return_storage_ptr__->value)._M_str = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

TypeParser::Token TypeParser::NextToken() {
    for (; cur_ < end_; ++cur_) {
        switch (*cur_) {
            case ' ':
            case '\n':
            case '\t':
            case '\0':
                continue;

            case '=':
                return Token{Token::Assign, std::string_view(cur_++, 1)};
            case '(':
                return Token{Token::LPar, std::string_view(cur_++, 1)};
            case ')':
                return Token{Token::RPar, std::string_view(cur_++, 1)};
            case ',':
                return Token{Token::Comma, std::string_view(cur_++, 1)};

            default: {
                const char* st = cur_;

                if (*cur_ == '\'') {
                    for (st = ++cur_; cur_ < end_; ++cur_) {
                        if (*cur_ == '\'') {
                            return Token{Token::String, std::string_view(st, cur_++ - st)};
                        }
                    }

                    return Token{Token::Invalid, std::string_view()};
                }

                if (isalpha(*cur_) || *cur_ == '_') {
                    for (; cur_ < end_; ++cur_) {
                        if (!isalpha(*cur_) && !isdigit(*cur_) && *cur_ != '_') {
                            break;
                        }
                    }

                    return Token{Token::Name, std::string_view(st, cur_ - st)};
                }

                if (isdigit(*cur_) || *cur_ == '-') {
                    for (++cur_; cur_ < end_; ++cur_) {
                        if (!isdigit(*cur_)) {
                            break;
                        }
                    }

                    return Token{Token::Number, std::string_view(st, cur_ - st)};
                }

                return Token{Token::Invalid, std::string_view()};
            }
        }
    }

    return Token{Token::EOS, std::string_view()};
}